

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void RelooperAddBranchForSwitch
               (RelooperBlockRef from,RelooperBlockRef to,BinaryenIndex *indexes,
               BinaryenIndex numIndexes,BinaryenExpressionRef code)

{
  uint local_4c;
  undefined1 local_48 [4];
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  BinaryenExpressionRef code_local;
  BinaryenIndex numIndexes_local;
  BinaryenIndex *indexes_local;
  RelooperBlockRef to_local;
  RelooperBlockRef from_local;
  
  values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)code;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  for (local_4c = 0; local_4c < numIndexes; local_4c = local_4c + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,indexes + local_4c);
  }
  CFG::Block::AddSwitchBranchTo
            (from,to,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
             (Expression *)
             values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void RelooperAddBranchForSwitch(RelooperBlockRef from,
                                RelooperBlockRef to,
                                BinaryenIndex* indexes,
                                BinaryenIndex numIndexes,
                                BinaryenExpressionRef code) {
  std::vector<Index> values;
  for (Index i = 0; i < numIndexes; i++) {
    values.push_back(indexes[i]);
  }
  ((CFG::Block*)from)
    ->AddSwitchBranchTo((CFG::Block*)to, std::move(values), (Expression*)code);
}